

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

int zip_entry_open(zip_t *zip,char *entryname)

{
  mz_zip_mode mVar1;
  mz_uint mVar2;
  mz_uint mVar3;
  mz_bool mVar4;
  uint uVar5;
  size_t n;
  char *pcVar6;
  size_t sVar7;
  time_t tVar8;
  char newchar;
  char oldchar;
  ulong uVar9;
  mz_uint64 mVar10;
  mz_zip_archive_file_stat stats;
  mz_zip_archive_file_stat local_270;
  
  newchar = entryname == (char *)0x0 || zip == (zip_t *)0x0;
  if ((entryname != (char *)0x0 && zip != (zip_t *)0x0) && (n = strlen(entryname), n != 0)) {
    pcVar6 = strrpl(entryname,n,oldchar,newchar);
    (zip->entry).name = pcVar6;
    if (pcVar6 != (char *)0x0) {
      mVar1 = (zip->archive).m_zip_mode;
      if (mVar1 == MZ_ZIP_MODE_READING) {
        mVar3 = mz_zip_reader_locate_file(&zip->archive,pcVar6,(char *)0x0,0);
        (zip->entry).index = mVar3;
        if ((-1 < (int)mVar3) &&
           (mVar4 = mz_zip_reader_file_stat(&zip->archive,mVar3,&local_270), mVar4 != 0)) {
          (zip->entry).comp_size = local_270.m_comp_size;
          (zip->entry).uncomp_size = local_270.m_uncomp_size;
          (zip->entry).uncomp_crc32 = local_270.m_crc32;
          (zip->entry).offset = (ulong)local_270.m_central_dir_ofs;
          (zip->entry).header_offset = local_270.m_local_header_ofs;
          (zip->entry).method = local_270.m_method;
          (zip->entry).external_attr = local_270.m_external_attr;
          (zip->entry).m_time = local_270.m_time;
          return 0;
        }
      }
      else {
        mVar10 = (zip->archive).m_archive_size;
        mVar3 = (zip->archive).m_file_offset_alignment;
        mVar2 = (zip->archive).m_total_files;
        (zip->entry).index = mVar2;
        (zip->entry).uncomp_size = 0;
        (zip->entry).comp_size = 0;
        (zip->entry).uncomp_crc32 = 0;
        (zip->entry).offset = mVar10;
        (zip->entry).header_offset = mVar10;
        (zip->entry).header[0] = '\0';
        (zip->entry).header[1] = '\0';
        (zip->entry).header[2] = '\0';
        (zip->entry).header[3] = '\0';
        (zip->entry).header[4] = '\0';
        (zip->entry).header[5] = '\0';
        (zip->entry).header[6] = '\0';
        (zip->entry).header[7] = '\0';
        (zip->entry).header[8] = '\0';
        (zip->entry).header[9] = '\0';
        (zip->entry).header[10] = '\0';
        (zip->entry).header[0xb] = '\0';
        (zip->entry).header[0xc] = '\0';
        (zip->entry).header[0xd] = '\0';
        (zip->entry).header[0xe] = '\0';
        (zip->entry).header[0xf] = '\0';
        (zip->entry).header[0xe] = '\0';
        (zip->entry).header[0xf] = '\0';
        (zip->entry).header[0x10] = '\0';
        (zip->entry).header[0x11] = '\0';
        (zip->entry).header[0x12] = '\0';
        (zip->entry).header[0x13] = '\0';
        (zip->entry).header[0x14] = '\0';
        (zip->entry).header[0x15] = '\0';
        (zip->entry).header[0x16] = '\0';
        (zip->entry).header[0x17] = '\0';
        (zip->entry).header[0x18] = '\0';
        (zip->entry).header[0x19] = '\0';
        (zip->entry).header[0x1a] = '\0';
        (zip->entry).header[0x1b] = '\0';
        (zip->entry).header[0x1c] = '\0';
        (zip->entry).header[0x1d] = '\0';
        (zip->entry).method = 0;
        (zip->entry).external_attr = 0;
        uVar5 = mVar3 - ((uint)mVar10 & mVar3 - 1) & mVar3 - 1;
        if (mVar3 == 0) {
          uVar5 = 0;
        }
        if ((((mVar1 == MZ_ZIP_MODE_WRITING) &&
             ((zip->archive).m_pState != (mz_zip_internal_state *)0x0)) &&
            (mVar2 != 0xffff && (zip->level & 0x400) == 0)) &&
           (uVar9 = (ulong)uVar5, n + mVar10 + uVar9 + 0x4c >> 0x20 == 0)) {
          mVar4 = mz_zip_writer_write_zeros(&zip->archive,mVar10,(mz_uint32)(uVar9 + 0x1e));
          if (mVar4 != 0) {
            mVar10 = uVar9 + (zip->entry).header_offset;
            (zip->entry).header_offset = mVar10;
            mVar3 = (zip->archive).m_file_offset_alignment;
            if ((mVar3 != 0) && (((uint)mVar10 & mVar3 - 1) != 0)) {
              __assert_fail("(zip->entry.header_offset & (pzip->m_file_offset_alignment - 1)) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/contrib/zip/src/zip.c"
                            ,0x139,"int zip_entry_open(struct zip_t *, const char *)");
            }
            mVar10 = uVar9 + 0x1e + (zip->entry).offset;
            (zip->entry).offset = mVar10;
            sVar7 = (*(zip->archive).m_pWrite)
                              ((zip->archive).m_pIO_opaque,mVar10,(zip->entry).name,n);
            if (sVar7 == n) {
              mVar10 = (zip->entry).offset + n;
              (zip->entry).offset = mVar10;
              uVar5 = zip->level & 0xf;
              if (uVar5 != 0) {
                (zip->entry).state.m_pZip = &zip->archive;
                (zip->entry).state.m_cur_archive_file_ofs = mVar10;
                (zip->entry).state.m_comp_size = 0;
                uVar9 = 10;
                if (uVar5 < 10) {
                  uVar9 = (ulong)uVar5;
                }
                tdefl_init(&(zip->entry).comp,mz_zip_writer_add_put_buf_callback,&(zip->entry).state
                           ,(uint)(uVar5 < 4) << 0xe |
                            tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes
                            [uVar9]);
              }
              tVar8 = time((time_t *)0x0);
              (zip->entry).m_time = tVar8;
              return 0;
            }
          }
        }
      }
      pcVar6 = (zip->entry).name;
      if (pcVar6 != (char *)0x0) {
        free(pcVar6);
        (zip->entry).name = (char *)0x0;
      }
    }
  }
  return -1;
}

Assistant:

int zip_entry_open(struct zip_t *zip, const char *entryname) {
  size_t entrylen = 0;
  mz_zip_archive *pzip = NULL;
  mz_uint num_alignment_padding_bytes, level;
  mz_zip_archive_file_stat stats;

  if (!zip || !entryname) {
    return -1;
  }

  entrylen = strlen(entryname);
  if (entrylen < 1) {
    return -1;
  }

  /*
    .ZIP File Format Specification Version: 6.3.3

    4.4.17.1 The name of the file, with optional relative path.
    The path stored MUST not contain a drive or
    device letter, or a leading slash.  All slashes
    MUST be forward slashes '/' as opposed to
    backwards slashes '\' for compatibility with Amiga
    and UNIX file systems etc.  If input came from standard
    input, there is no file name field.
  */
  zip->entry.name = strrpl(entryname, entrylen, '\\', '/');
  if (!zip->entry.name) {
    // Cannot parse zip entry name
    return -1;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode == MZ_ZIP_MODE_READING) {
    zip->entry.index =
        mz_zip_reader_locate_file(pzip, zip->entry.name, NULL, 0);
    if (zip->entry.index < 0) {
      goto cleanup;
    }

    if (!mz_zip_reader_file_stat(pzip, (mz_uint)zip->entry.index, &stats)) {
      goto cleanup;
    }

    zip->entry.comp_size = stats.m_comp_size;
    zip->entry.uncomp_size = stats.m_uncomp_size;
    zip->entry.uncomp_crc32 = stats.m_crc32;
    zip->entry.offset = stats.m_central_dir_ofs;
    zip->entry.header_offset = stats.m_local_header_ofs;
    zip->entry.method = stats.m_method;
    zip->entry.external_attr = stats.m_external_attr;
    zip->entry.m_time = stats.m_time;

    return 0;
  }

  zip->entry.index = (int)zip->archive.m_total_files;
  zip->entry.comp_size = 0;
  zip->entry.uncomp_size = 0;
  zip->entry.uncomp_crc32 = MZ_CRC32_INIT;
  zip->entry.offset = zip->archive.m_archive_size;
  zip->entry.header_offset = zip->archive.m_archive_size;
  memset(zip->entry.header, 0, MZ_ZIP_LOCAL_DIR_HEADER_SIZE * sizeof(mz_uint8));
  zip->entry.method = 0;
  zip->entry.external_attr = 0;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pzip);

  if (!pzip->m_pState || (pzip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
    // Wrong zip mode
    goto cleanup;
  }
  if (zip->level & MZ_ZIP_FLAG_COMPRESSED_DATA) {
    // Wrong zip compression level
    goto cleanup;
  }
  // no zip64 support yet
  if ((pzip->m_total_files == 0xFFFF) ||
      ((pzip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        entrylen) > 0xFFFFFFFF)) {
    // No zip64 support yet
    goto cleanup;
  }
  if (!mz_zip_writer_write_zeros(pzip, zip->entry.offset,
                                 num_alignment_padding_bytes +
                                     sizeof(zip->entry.header))) {
    // Cannot memset zip entry header
    goto cleanup;
  }

  zip->entry.header_offset += num_alignment_padding_bytes;
  if (pzip->m_file_offset_alignment) {
    MZ_ASSERT(
        (zip->entry.header_offset & (pzip->m_file_offset_alignment - 1)) == 0);
  }
  zip->entry.offset += num_alignment_padding_bytes + sizeof(zip->entry.header);

  if (pzip->m_pWrite(pzip->m_pIO_opaque, zip->entry.offset, zip->entry.name,
                     entrylen) != entrylen) {
    // Cannot write data to zip entry
    goto cleanup;
  }

  zip->entry.offset += entrylen;
  level = zip->level & 0xF;
  if (level) {
    zip->entry.state.m_pZip = pzip;
    zip->entry.state.m_cur_archive_file_ofs = zip->entry.offset;
    zip->entry.state.m_comp_size = 0;

    if (tdefl_init(&(zip->entry.comp), mz_zip_writer_add_put_buf_callback,
                   &(zip->entry.state),
                   (int)tdefl_create_comp_flags_from_zip_params(
                       (int)level, -15, MZ_DEFAULT_STRATEGY)) !=
        TDEFL_STATUS_OKAY) {
      // Cannot initialize the zip compressor
      goto cleanup;
    }
  }

  zip->entry.m_time = time(NULL);

  return 0;

cleanup:
  CLEANUP(zip->entry.name);
  return -1;
}